

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_currency.cpp
# Opt level: O2

bool __thiscall
icu_63::numparse::impl::CombinedCurrencyMatcher::matchCurrency
          (CombinedCurrencyMatcher *this,StringSegment *segment,ParsedNumber *result,
          UErrorCode *status)

{
  short sVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int32_t longestFullMatch;
  UnicodeString *other;
  long lVar7;
  bool bVar8;
  bool bVar9;
  int32_t partialMatchLen;
  ParsePosition ppos;
  UnicodeString segmentString;
  
  if ((ushort)(this->fCurrency1).fUnion.fStackFields.fLengthAndFlags < 0x20) {
    iVar2 = -1;
  }
  else {
    iVar2 = StringSegment::getCaseSensitivePrefixLength(segment,&this->fCurrency1);
  }
  iVar3 = StringSegment::length(segment);
  bVar8 = iVar2 == iVar3;
  sVar1 = (this->fCurrency1).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (this->fCurrency1).fUnion.fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar2 == iVar4) {
    result->currencyCode[2] = this->fCurrencyCode[2];
    *(undefined4 *)result->currencyCode = *(undefined4 *)this->fCurrencyCode;
    result->currencyCode[3] = L'\0';
    StringSegment::adjustOffset(segment,iVar2);
  }
  else {
    if ((ushort)(this->fCurrency2).fUnion.fStackFields.fLengthAndFlags < 0x20) {
      iVar4 = -1;
    }
    else {
      iVar4 = StringSegment::getCommonPrefixLength(segment,&this->fCurrency2);
    }
    bVar8 = true;
    if (iVar2 != iVar3) {
      iVar2 = StringSegment::length(segment);
      bVar8 = iVar4 == iVar2;
    }
    sVar1 = (this->fCurrency2).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (this->fCurrency2).fUnion.fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    if (iVar4 != iVar5) {
      if (this->fUseFullCurrencyData != false) {
        StringSegment::toTempUnicodeString(&segmentString,segment);
        ppos.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003ce098;
        partialMatchLen = 0;
        ppos.index = 0;
        ppos.errorIndex = -1;
        uprv_parseCurrency_63
                  ((this->fLocaleName).buffer.ptr,&segmentString,&ppos,'\0',&partialMatchLen,
                   result->currencyCode,status);
        iVar2 = partialMatchLen;
        bVar9 = true;
        if (bVar8 == false) {
          iVar3 = StringSegment::length(segment);
          bVar9 = iVar2 == iVar3;
        }
        if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (ppos.index != 0)) {
          StringSegment::adjustOffset(segment,ppos.index);
          ParsedNumber::setCharsConsumed(result,segment);
        }
        ParsePosition::~ParsePosition(&ppos);
        UnicodeString::~UnicodeString(&segmentString);
        return bVar9;
      }
      other = (UnicodeString *)&this->field_0x98;
      iVar4 = 0;
      lVar7 = 6;
      while (bVar9 = lVar7 != 0, lVar7 = lVar7 + -1, bVar9) {
        iVar2 = StringSegment::getCommonPrefixLength(segment,other);
        sVar1 = (other->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar5 = (other->fUnion).fFields.fLength;
        }
        else {
          iVar5 = (int)sVar1 >> 5;
        }
        iVar6 = iVar4;
        if (iVar4 < iVar5) {
          iVar6 = iVar5;
        }
        if (iVar2 == iVar5) {
          iVar4 = iVar6;
        }
        bVar8 = (bool)(bVar8 | 0 < iVar2);
        other = other + 1;
      }
      if (iVar4 < 1) {
        return bVar8;
      }
    }
    result->currencyCode[2] = this->fCurrencyCode[2];
    *(undefined4 *)result->currencyCode = *(undefined4 *)this->fCurrencyCode;
    result->currencyCode[3] = L'\0';
    StringSegment::adjustOffset(segment,iVar4);
  }
  ParsedNumber::setCharsConsumed(result,segment);
  return bVar8;
}

Assistant:

bool CombinedCurrencyMatcher::matchCurrency(StringSegment& segment, ParsedNumber& result,
                                            UErrorCode& status) const {
    bool maybeMore = false;

    int32_t overlap1;
    if (!fCurrency1.isEmpty()) {
        overlap1 = segment.getCaseSensitivePrefixLength(fCurrency1);
    } else {
        overlap1 = -1;
    }
    maybeMore = maybeMore || overlap1 == segment.length();
    if (overlap1 == fCurrency1.length()) {
        utils::copyCurrencyCode(result.currencyCode, fCurrencyCode);
        segment.adjustOffset(overlap1);
        result.setCharsConsumed(segment);
        return maybeMore;
    }

    int32_t overlap2;
    if (!fCurrency2.isEmpty()) {
        // ISO codes should be accepted case-insensitive.
        // https://unicode-org.atlassian.net/browse/ICU-13696
        overlap2 = segment.getCommonPrefixLength(fCurrency2);
    } else {
        overlap2 = -1;
    }
    maybeMore = maybeMore || overlap2 == segment.length();
    if (overlap2 == fCurrency2.length()) {
        utils::copyCurrencyCode(result.currencyCode, fCurrencyCode);
        segment.adjustOffset(overlap2);
        result.setCharsConsumed(segment);
        return maybeMore;
    }

    if (fUseFullCurrencyData) {
        // Use the full currency data.
        // NOTE: This call site should be improved with #13584.
        const UnicodeString segmentString = segment.toTempUnicodeString();

        // Try to parse the currency
        ParsePosition ppos(0);
        int32_t partialMatchLen = 0;
        uprv_parseCurrency(
                fLocaleName.data(),
                segmentString,
                ppos,
                UCURR_SYMBOL_NAME, // checks for both UCURR_SYMBOL_NAME and UCURR_LONG_NAME
                &partialMatchLen,
                result.currencyCode,
                status);
        maybeMore = maybeMore || partialMatchLen == segment.length();

        if (U_SUCCESS(status) && ppos.getIndex() != 0) {
            // Complete match.
            // NOTE: The currency code should already be saved in the ParsedNumber.
            segment.adjustOffset(ppos.getIndex());
            result.setCharsConsumed(segment);
            return maybeMore;
        }

    } else {
        // Use the locale long names.
        int32_t longestFullMatch = 0;
        for (int32_t i=0; i<StandardPlural::COUNT; i++) {
            const UnicodeString& name = fLocalLongNames[i];
            int32_t overlap = segment.getCommonPrefixLength(name);
            if (overlap == name.length() && name.length() > longestFullMatch) {
                longestFullMatch = name.length();
            }
            maybeMore = maybeMore || overlap > 0;
        }
        if (longestFullMatch > 0) {
            utils::copyCurrencyCode(result.currencyCode, fCurrencyCode);
            segment.adjustOffset(longestFullMatch);
            result.setCharsConsumed(segment);
            return maybeMore;
        }
    }

    // No match found.
    return maybeMore;
}